

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

bool __thiscall BanMan::IsBanned(BanMan *this,CSubNet *sub_net)

{
  long lVar1;
  int64_t iVar2;
  iterator iVar3;
  bool bVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = GetTime();
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock7,&this->m_banned_mutex,"m_banned_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/banman.cpp",
             0x6b,false);
  iVar3 = std::
          _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          ::find(&(this->m_banned)._M_t,sub_net);
  if (((_Rb_tree_header *)iVar3._M_node == &(this->m_banned)._M_t._M_impl.super__Rb_tree_header) ||
     (bVar4 = true, (long)iVar3._M_node[3]._M_parent <= iVar2)) {
    bVar4 = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BanMan::IsBanned(const CSubNet& sub_net)
{
    auto current_time = GetTime();
    LOCK(m_banned_mutex);
    banmap_t::iterator i = m_banned.find(sub_net);
    if (i != m_banned.end()) {
        CBanEntry ban_entry = (*i).second;
        if (current_time < ban_entry.nBanUntil) {
            return true;
        }
    }
    return false;
}